

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O2

void __thiscall
iu_MatcherFailure_x_iutest_x_EachAllOf_Test::Body(iu_MatcherFailure_x_iutest_x_EachAllOf_Test *this)

{
  TestFlag *pTVar1;
  vector<int,_std::allocator<int>_> *v;
  AssertionResult *in_R8;
  ScopedSPITestFlag guard;
  string local_290;
  SPIFailureChecker iutest_failure_checker;
  AssertionResult iutest_spi_ar;
  string local_210;
  iuCodeMessage local_1f0;
  AssertionResult iutest_ar;
  undefined1 local_198 [16];
  undefined **local_188;
  undefined8 local_180;
  undefined **local_178;
  iuCodeMessage *local_170;
  
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  local_170 = &local_1f0;
  local_1f0.m_message._M_dataplus._M_p._0_4_ = 0;
  local_180 = &local_290;
  local_290._M_dataplus._M_p._0_4_ = 5;
  local_198._0_8_ = &PTR__EachMatcher_00227c00;
  local_198._8_8_ = &PTR__AllOfMatcher_00227bc0;
  local_188 = &PTR__IMatcher_00224780;
  local_178 = &PTR__IMatcher_00224880;
  iutest::detail::
  EachMatcher<iutest::detail::AllOfMatcher<iutest::detail::GeMatcher<int>,iutest::detail::LeMatcher<int>>>
  ::operator()(&iutest_ar,
               (EachMatcher<iutest::detail::AllOfMatcher<iutest::detail::GeMatcher<int>,iutest::detail::LeMatcher<int>>>
                *)local_198,(vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::va);
  if (iutest_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    iutest::PrintToString<std::vector<int,std::allocator<int>>>
              (&local_210,(iutest *)&(anonymous_namespace)::va,v);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_290,(detail *)local_210._M_dataplus._M_p,"Each(AllOf( Ge(0), Le(5) ))",
               (char *)&iutest_ar,in_R8);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1f0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x3a4,(char *)CONCAT44(local_290._M_dataplus._M_p._4_4_,
                                       local_290._M_dataplus._M_p._0_4_));
    local_1f0._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1f0,(Fixed *)local_198);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_210);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  pTVar1 = iutest::TestFlag::GetInstance();
  pTVar1->m_test_flags = (int)guard.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_198,"Each: Ge: 0 and Le: 5",(allocator<char> *)&local_1f0);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)local_198);
  std::__cxx11::string::~string((string *)local_198);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x3a4,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)local_198);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  return;
}

Assistant:

IUTEST(MatcherFailure, EachAllOf)
{
    CHECK_FAILURE( IUTEST_ASSERT_THAT(va
        , Each(AllOf( Ge(0), Le(5) ))), "Each: Ge: 0 and Le: 5");
}